

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_custom_hsm.c
# Opt level: O2

HSM_CLIENT_HANDLE prov_custom_hsm_create(void)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)malloc(0x48);
  if (puVar1 == (undefined8 *)0x0) {
    puts("Failued allocating hsm info\r");
  }
  else {
    *puVar1 = 
    "-----BEGIN CERTIFICATE-----\nBASE64 Encoded certificate Here\n-----END CERTIFICATE-----";
    puVar1[2] = 
    "-----BEGIN PRIVATE KEY-----\nBASE64 Encoded certificate Here\n-----END PRIVATE KEY-----";
    puVar1[1] = "custom-hsm-example";
    puVar1[3] = "Endorsement key\r\n";
    puVar1[4] = 0x11;
    puVar1[5] = "Store root key\r\n";
    puVar1[6] = 0x10;
    puVar1[7] = "Symmetric Key value";
    puVar1[8] = "Registration Name";
  }
  return puVar1;
}

Assistant:

HSM_CLIENT_HANDLE prov_custom_hsm_create()
{
    HSM_CLIENT_HANDLE result;
    CUSTOM_HSM_SAMPLE_INFO* hsm_info = malloc(sizeof(CUSTOM_HSM_SAMPLE_INFO));
    if (hsm_info == NULL)
    {
        (void)printf("Failued allocating hsm info\r\n");
        result = NULL;
    }
    else
    {
        // TODO: initialize any variables here
        hsm_info->certificate = CERTIFICATE;
        hsm_info->key = PRIVATE_KEY;
        hsm_info->common_name = COMMON_NAME;
        hsm_info->endorsment_key = EK;
        hsm_info->ek_length = EK_LEN;
        hsm_info->storage_root_key = SRK;
        hsm_info->srk_len = SRK_LEN;
        hsm_info->symm_key = SYMMETRIC_KEY;
        hsm_info->registration_name = REGISTRATION_NAME;
        result = hsm_info;
    }
    return result;
}